

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O1

void __thiscall HEkkPrimal::initialiseSolve(HEkkPrimal *this)

{
  HEkk *pHVar1;
  HighsOptions *pHVar2;
  double dVar3;
  EdgeWeightMode EVar4;
  uint uVar5;
  value_type_conflict1 local_10;
  
  pHVar1 = this->ekk_instance_;
  pHVar2 = pHVar1->options_;
  dVar3 = (pHVar2->super_HighsOptionsStruct).dual_feasibility_tolerance;
  this->primal_feasibility_tolerance =
       (pHVar2->super_HighsOptionsStruct).primal_feasibility_tolerance;
  this->dual_feasibility_tolerance = dVar3;
  this->objective_target = (pHVar2->super_HighsOptionsStruct).objective_target;
  (pHVar1->status_).has_dual_objective_value = false;
  (pHVar1->status_).has_primal_objective_value = false;
  pHVar1->model_status_ = kMin;
  pHVar1->solve_bailout_ = false;
  pHVar1->called_return_from_solve_ = false;
  pHVar1->exit_algorithm_ = kPrimal;
  this->rebuild_reason = 0;
  if ((pHVar1->status_).has_dual_steepest_edge_weights == false) {
    local_10 = 1.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&pHVar1->dual_edge_weight_,(long)this->num_row,&local_10);
    std::vector<double,_std::allocator<double>_>::resize
              (&this->ekk_instance_->scattered_dual_edge_weight_,(long)this->num_tot);
  }
  uVar5 = (this->ekk_instance_->options_->super_HighsOptionsStruct).
          simplex_primal_edge_weight_strategy + 1;
  EVar4 = kSteepestEdge;
  if (uVar5 < 3) {
    EVar4 = *(EdgeWeightMode *)(&DAT_003dd03c + (ulong)uVar5 * 4);
  }
  this->edge_weight_mode = EVar4;
  if (EVar4 == kSteepestEdge) {
    computePrimalSteepestEdgeWeights(this);
  }
  else if (EVar4 == kDevex) {
    initialiseDevexFramework(this);
  }
  else if (EVar4 == kDantzig) {
    local_10 = 1.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&this->edge_weight_,(long)this->num_tot,&local_10);
  }
  return;
}

Assistant:

void HEkkPrimal::initialiseSolve() {
  // Copy values of simplex solver options to dual simplex options
  primal_feasibility_tolerance =
      ekk_instance_.options_->primal_feasibility_tolerance;
  dual_feasibility_tolerance =
      ekk_instance_.options_->dual_feasibility_tolerance;
  objective_target = ekk_instance_.options_->objective_target;

  ekk_instance_.status_.has_primal_objective_value = false;
  ekk_instance_.status_.has_dual_objective_value = false;

  ekk_instance_.model_status_ = HighsModelStatus::kNotset;
  ekk_instance_.solve_bailout_ = false;
  ekk_instance_.called_return_from_solve_ = false;
  ekk_instance_.exit_algorithm_ = SimplexAlgorithm::kPrimal;

  rebuild_reason = kRebuildReasonNo;
  if (!ekk_instance_.status_.has_dual_steepest_edge_weights) {
    // No dual weights to maintain, so ensure that the vectors are
    // assigned since they are used around factorization and when
    // setting up the backtracking information. ToDo Eliminate this
    // opacity
    ekk_instance_.dual_edge_weight_.assign(num_row, 1.0);
    ekk_instance_.scattered_dual_edge_weight_.resize(num_tot);
  }
  const HighsInt edge_weight_strategy =
      ekk_instance_.options_->simplex_primal_edge_weight_strategy;
  if (edge_weight_strategy == kSimplexEdgeWeightStrategyChoose ||
      edge_weight_strategy == kSimplexEdgeWeightStrategyDevex) {
    // By default, use Devex
    edge_weight_mode = EdgeWeightMode::kDevex;
  } else if (edge_weight_strategy == kSimplexEdgeWeightStrategyDantzig) {
    edge_weight_mode = EdgeWeightMode::kDantzig;
  } else {
    assert(edge_weight_strategy == kSimplexEdgeWeightStrategySteepestEdge);
    edge_weight_mode = EdgeWeightMode::kSteepestEdge;
  }
  if (edge_weight_mode == EdgeWeightMode::kDantzig) {
    edge_weight_.assign(num_tot, 1.0);
  } else if (edge_weight_mode == EdgeWeightMode::kDevex) {
    initialiseDevexFramework();
  } else if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
    computePrimalSteepestEdgeWeights();
  }
}